

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionHelper.cpp
# Opt level: O0

EStatusCode __thiscall
EncryptionHelper::WriteState
          (EncryptionHelper *this,ObjectsContext *inStateWriter,ObjectIDType inObjectID)

{
  DictionaryContext *pDVar1;
  ByteList *inByteList;
  bool bVar2;
  bool local_361;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  DictionaryContext *local_38;
  DictionaryContext *encryptionObject;
  ObjectIDType OStack_28;
  EStatusCode status;
  ObjectIDType inObjectID_local;
  ObjectsContext *inStateWriter_local;
  EncryptionHelper *this_local;
  
  OStack_28 = inObjectID;
  inObjectID_local = (ObjectIDType)inStateWriter;
  inStateWriter_local = (ObjectsContext *)this;
  encryptionObject._4_4_ = ObjectsContext::StartNewIndirectObject(inStateWriter,inObjectID);
  this_local._4_4_ = encryptionObject._4_4_;
  if (encryptionObject._4_4_ == eSuccess) {
    pDVar1 = ObjectsContext::StartDictionary((ObjectsContext *)inObjectID_local);
    local_38 = pDVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Type",&local_59);
    DictionaryContext::WriteKey(pDVar1,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"EncryptionHelper",&local_91);
    DictionaryContext::WriteNameValue(pDVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"mIsDocumentEncrypted",&local_b9);
    DictionaryContext::WriteKey(pDVar1,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    DictionaryContext::WriteBooleanValue(local_38,(bool)(this->mIsDocumentEncrypted & 1));
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"mSupportsEncryption",&local_e1);
    DictionaryContext::WriteKey(pDVar1,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    DictionaryContext::WriteBooleanValue(local_38,(bool)(this->mSupportsEncryption & 1));
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"mUsingAES",&local_109);
    DictionaryContext::WriteKey(pDVar1,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    pDVar1 = local_38;
    if (this->mXcryptAuthentication == (XCryptionCommon *)0x0) {
      local_361 = false;
    }
    else {
      local_361 = XCryptionCommon::IsUsingAES(this->mXcryptAuthentication);
    }
    DictionaryContext::WriteBooleanValue(pDVar1,local_361);
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"mLength",&local_131);
    DictionaryContext::WriteKey(pDVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    DictionaryContext::WriteIntegerValue(local_38,(ulong)this->mLength);
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mV",&local_159);
    DictionaryContext::WriteKey(pDVar1,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    DictionaryContext::WriteIntegerValue(local_38,(ulong)this->mV);
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"mRevision",&local_181);
    DictionaryContext::WriteKey(pDVar1,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    DictionaryContext::WriteIntegerValue(local_38,(ulong)this->mRevision);
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"mP",&local_1a9);
    DictionaryContext::WriteKey(pDVar1,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    DictionaryContext::WriteIntegerValue(local_38,this->mP);
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"mEncryptMetaData",&local_1d1);
    DictionaryContext::WriteKey(pDVar1,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    DictionaryContext::WriteBooleanValue(local_38,(bool)(this->mEncryptMetaData & 1));
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"mFileIDPart1",&local_1f9);
    DictionaryContext::WriteKey(pDVar1,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    pDVar1 = local_38;
    XCryptionCommon::ByteListToString(&local_220,&this->mFileIDPart1);
    DictionaryContext::WriteLiteralStringValue(pDVar1,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"mO",&local_241);
    DictionaryContext::WriteKey(pDVar1,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    pDVar1 = local_38;
    XCryptionCommon::ByteListToString(&local_268,&this->mO);
    DictionaryContext::WriteLiteralStringValue(pDVar1,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"mU",&local_289);
    DictionaryContext::WriteKey(pDVar1,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    pDVar1 = local_38;
    XCryptionCommon::ByteListToString(&local_2b0,&this->mU);
    DictionaryContext::WriteLiteralStringValue(pDVar1,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"InitialEncryptionKey",&local_2d1);
    DictionaryContext::WriteKey(pDVar1,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    pDVar1 = local_38;
    bVar2 = this->mXcryptAuthentication == (XCryptionCommon *)0x0;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"",&local_2f9);
    }
    else {
      inByteList = XCryptionCommon::GetInitialEncryptionKey_abi_cxx11_(this->mXcryptAuthentication);
      XCryptionCommon::ByteListToString(&local_2f8,inByteList);
    }
    DictionaryContext::WriteLiteralStringValue(pDVar1,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    if (bVar2) {
      std::allocator<char>::~allocator(&local_2f9);
    }
    ObjectsContext::EndDictionary((ObjectsContext *)inObjectID_local,local_38);
    ObjectsContext::EndIndirectObject((ObjectsContext *)inObjectID_local);
    this_local._4_4_ = encryptionObject._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode EncryptionHelper::WriteState(ObjectsContext* inStateWriter, ObjectIDType inObjectID)
{
	EStatusCode status = inStateWriter->StartNewIndirectObject(inObjectID);
	if(status != eSuccess)
		return status;
	DictionaryContext* encryptionObject = inStateWriter->StartDictionary();

	encryptionObject->WriteKey("Type");
	encryptionObject->WriteNameValue("EncryptionHelper");

	encryptionObject->WriteKey("mIsDocumentEncrypted");
	encryptionObject->WriteBooleanValue(mIsDocumentEncrypted);

	encryptionObject->WriteKey("mSupportsEncryption");
	encryptionObject->WriteBooleanValue(mSupportsEncryption);

	encryptionObject->WriteKey("mUsingAES");
	encryptionObject->WriteBooleanValue(mXcryptAuthentication ? mXcryptAuthentication->IsUsingAES():false);

	encryptionObject->WriteKey("mLength");
	encryptionObject->WriteIntegerValue(mLength);

	encryptionObject->WriteKey("mV");
	encryptionObject->WriteIntegerValue(mV);

	encryptionObject->WriteKey("mRevision");
	encryptionObject->WriteIntegerValue(mRevision);

	encryptionObject->WriteKey("mP");
	encryptionObject->WriteIntegerValue(mP);

	encryptionObject->WriteKey("mEncryptMetaData");
	encryptionObject->WriteBooleanValue(mEncryptMetaData);

	encryptionObject->WriteKey("mFileIDPart1");
	encryptionObject->WriteLiteralStringValue(XCryptionCommon::ByteListToString(mFileIDPart1));

	encryptionObject->WriteKey("mO");
	encryptionObject->WriteLiteralStringValue(XCryptionCommon::ByteListToString(mO));

	encryptionObject->WriteKey("mU");
	encryptionObject->WriteLiteralStringValue(XCryptionCommon::ByteListToString(mU));

	encryptionObject->WriteKey("InitialEncryptionKey");
	encryptionObject->WriteLiteralStringValue(mXcryptAuthentication ? XCryptionCommon::ByteListToString(mXcryptAuthentication->GetInitialEncryptionKey()) : "");

	inStateWriter->EndDictionary(encryptionObject);
	inStateWriter->EndIndirectObject();

	return status;
}